

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_4::loadFlatScanLineImage(string *fileName,Header *hdr,FlatImage *img)

{
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  string *psVar6;
  FlatImageChannel *pFVar7;
  Box2i *pBVar8;
  Attribute *pAVar9;
  _Base_ptr in_RDX;
  Image *in_RSI;
  ConstIterator i_2;
  ConstIterator i_1;
  FrameBuffer fb;
  FlatImageLevel *level;
  ConstIterator i;
  ChannelList *cl;
  InputFile in;
  FlatImageLevel *in_stack_fffffffffffffdd8;
  Image *in_stack_fffffffffffffde0;
  Image *in_stack_fffffffffffffdf0;
  allocator<char> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined1 local_118 [56];
  iterator local_e0;
  iterator local_d0;
  string local_c0 [48];
  ImageLevel *local_90;
  allocator<char> local_81;
  string local_80 [32];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_40;
  FrameBuffer local_38;
  
  local_38._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_RDX;
  local_38._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)in_RSI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_38,pcVar4,iVar3);
  Imf_3_4::InputFile::header();
  local_40 = Imf_3_4::Header::channels();
  Image::clearChannels(in_stack_fffffffffffffdf0);
  local_58 = Imf_3_4::ChannelList::begin();
  while( true ) {
    local_60 = Imf_3_4::ChannelList::end();
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffde0,
                       (ConstIterator *)in_stack_fffffffffffffdd8);
    p_Var1 = local_38._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (!bVar2) break;
    ChannelList::ConstIterator::name((ConstIterator *)0x12ea2e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    ChannelList::ConstIterator::channel((ConstIterator *)0x12ea79);
    Image::insertChannel
              (in_stack_fffffffffffffde0,(string *)in_stack_fffffffffffffdd8,(Channel *)0x12eaa0);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffde0);
  }
  Imf_3_4::InputFile::header();
  uVar5 = Imf_3_4::Header::dataWindow();
  (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,uVar5,0);
  local_90 = (ImageLevel *)
             (**(code **)(*(long *)local_38._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_right + 0x18))
                       (local_38._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x12ebc9);
  local_d0._M_node = (_Base_ptr)FlatImageLevel::begin(in_stack_fffffffffffffdd8);
  FlatImageLevel::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_fffffffffffffde0,(Iterator *)in_stack_fffffffffffffdd8);
  while( true ) {
    local_e0._M_node = (_Base_ptr)FlatImageLevel::end(in_stack_fffffffffffffdd8);
    FlatImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffde0,(Iterator *)in_stack_fffffffffffffdd8);
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffde0,
                       (ConstIterator *)in_stack_fffffffffffffdd8);
    if (!bVar2) break;
    psVar6 = FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12ec76);
    pFVar7 = FlatImageLevel::ConstIterator::channel((ConstIterator *)0x12ec8a);
    (*(pFVar7->super_ImageChannel)._vptr_ImageChannel[4])(local_118);
    Imf_3_4::FrameBuffer::insert(local_c0,(Slice *)psVar6);
    FlatImageLevel::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffde0);
  }
  Imf_3_4::InputFile::setFrameBuffer(&local_38);
  pBVar8 = ImageLevel::dataWindow(local_90);
  iVar3 = (pBVar8->min).y;
  ImageLevel::dataWindow(local_90);
  Imf_3_4::InputFile::readPixels((int)&local_38,iVar3);
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::begin();
  while( true ) {
    Imf_3_4::InputFile::header();
    Imf_3_4::Header::end();
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffde0,
                       (ConstIterator *)in_stack_fffffffffffffdd8);
    if (!bVar2) break;
    pcVar4 = Header::ConstIterator::name((ConstIterator *)0x12ee00);
    iVar3 = strcmp(pcVar4,"tiles");
    if (iVar3 != 0) {
      in_stack_fffffffffffffde0 =
           (Image *)local_38._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      pAVar9 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x12ee37);
      in_stack_fffffffffffffdd8 =
           (FlatImageLevel *)Header::ConstIterator::attribute((ConstIterator *)0x12ee4b);
      Imf_3_4::Header::insert((char *)in_stack_fffffffffffffde0,pAVar9);
    }
    Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffde0);
  }
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x12ee8b);
  InputFile::~InputFile((InputFile *)in_stack_fffffffffffffde0);
  return;
}

Assistant:

void
loadFlatScanLineImage (const string& fileName, Header& hdr, FlatImage& img)
{
    InputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (in.header ().dataWindow (), ONE_LEVEL, ROUND_DOWN);

    FlatImageLevel& level = img.level ();
    FrameBuffer     fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);
    in.readPixels (level.dataWindow ().min.y, level.dataWindow ().max.y);

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        if (strcmp (i.name (), "tiles")) hdr.insert (i.name (), i.attribute ());
    }
}